

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase54::run(TestCase54 *this)

{
  Builder builder_00;
  Builder builder_01;
  Reader reader_00;
  Reader reader_01;
  ReaderOptions options;
  undefined8 in_stack_fffffffffffffce0;
  undefined8 in_stack_fffffffffffffce8;
  Reader local_2f8;
  ReaderOptions local_2c8;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_2b0;
  undefined1 local_2a0 [8];
  SegmentArrayMessageReader reader;
  Reader local_190;
  Builder local_160;
  Builder local_128;
  undefined1 local_100 [8];
  MallocMessageBuilder builder;
  TestCase54 *this_local;
  
  builder.moreSegments.builder.disposer = (ArrayDisposer *)this;
  MallocMessageBuilder::MallocMessageBuilder((MallocMessageBuilder *)local_100,0,FIXED_SIZE);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_128,(MessageBuilder *)local_100);
  builder_00._builder.capTable = (CapTableBuilder *)local_128._builder.data;
  builder_00._builder.segment = (SegmentBuilder *)local_128._builder.capTable;
  builder_00._builder.data = local_128._builder.pointers;
  builder_00._builder.pointers = (WirePointer *)local_128._builder._32_8_;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffffce0;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffce0 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffce0 >> 0x30);
  initTestMessage(builder_00);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_160,(MessageBuilder *)local_100);
  builder_01._builder.capTable = (CapTableBuilder *)local_160._builder.data;
  builder_01._builder.segment = (SegmentBuilder *)local_160._builder.capTable;
  builder_01._builder.data = local_160._builder.pointers;
  builder_01._builder.pointers = (WirePointer *)local_160._builder._32_8_;
  builder_01._builder.dataSize = (int)in_stack_fffffffffffffce0;
  builder_01._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffce0 >> 0x20);
  builder_01._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffce0 >> 0x30);
  checkTestMessage(builder_01);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)&reader.segments.size_,(MessageBuilder *)local_100);
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            (&local_190,(Builder *)&reader.segments.size_);
  reader_00._reader.capTable = (CapTableReader *)local_190._reader.data;
  reader_00._reader.segment = (SegmentReader *)local_190._reader.capTable;
  reader_00._reader.data = local_190._reader.pointers;
  reader_00._reader.pointers = (WirePointer *)local_190._reader._32_8_;
  reader_00._reader.dataSize = local_190._reader.nestingLimit;
  reader_00._reader.pointerCount = local_190._reader._44_2_;
  reader_00._reader._38_2_ = local_190._reader._46_2_;
  reader_00._reader._40_8_ = in_stack_fffffffffffffce8;
  checkTestMessage(reader_00);
  local_2b0 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)local_100);
  local_2c8.traversalLimitInWords = 0;
  local_2c8.nestingLimit = 0;
  local_2c8._12_4_ = 0;
  ReaderOptions::ReaderOptions(&local_2c8);
  options.nestingLimit = local_2c8.nestingLimit;
  options.traversalLimitInWords = local_2c8.traversalLimitInWords;
  options._12_4_ = 0;
  SegmentArrayMessageReader::SegmentArrayMessageReader
            ((SegmentArrayMessageReader *)local_2a0,local_2b0,options);
  MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_2f8,(MessageReader *)local_2a0);
  reader_01._reader.capTable = (CapTableReader *)local_2f8._reader.data;
  reader_01._reader.segment = (SegmentReader *)local_2f8._reader.capTable;
  reader_01._reader.data = local_2f8._reader.pointers;
  reader_01._reader.pointers = (WirePointer *)local_2f8._reader._32_8_;
  reader_01._reader.dataSize = local_2f8._reader.nestingLimit;
  reader_01._reader.pointerCount = local_2f8._reader._44_2_;
  reader_01._reader._38_2_ = local_2f8._reader._46_2_;
  reader_01._reader._40_8_ = in_stack_fffffffffffffce8;
  checkTestMessage(reader_01);
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_2a0);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_100);
  return;
}

Assistant:

TEST(Endian, TwoBytes) {
  byte bytes[] = {0x12, 0x34, 0x56, 0x78};

  WireValue<uint16_t>* vals = reinterpret_cast<WireValue<uint16_t>*>(bytes);

  EXPECT_EQ(0x3412, vals[0].get());
  EXPECT_EQ(0x7856, vals[1].get());

  vals[0].set(0x2345);
  vals[1].set(0x6789);

  EXPECT_EQ(0x45, bytes[0]);
  EXPECT_EQ(0x23, bytes[1]);
  EXPECT_EQ(0x89, bytes[2]);
  EXPECT_EQ(0x67, bytes[3]);
}